

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzEncoder.c
# Opt level: O2

void ZydisCompareRequestToInstruction
               (ZydisEncoderRequest *request,ZydisDecodedInstruction *insn,
               ZydisDecodedOperand *operands,ZyanU8 *insn_bytes)

{
  ZyanU8 *pZVar1;
  ZydisRegister ZVar2;
  ZydisInstructionCategory ZVar3;
  ulong uVar4;
  ZyanStatus ZVar5;
  ZydisMachineMode ZVar6;
  ZydisMnemonic *pZVar7;
  ulong uVar8;
  ZydisEncoderOperandImm_ *pZVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  ZydisDecoder decoder;
  ZydisDecodedInstruction knc_insn;
  ZydisDecodedOperand knc_operands [10];
  
  pZVar7 = &insn->mnemonic;
  if ((((request->mnemonic != ZYDIS_MNEMONIC_XCHG) || (request->operand_count != '\x02')) ||
      (request->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER)) ||
     (((request->operands[1].type != ZYDIS_OPERAND_TYPE_REGISTER ||
       (ZVar2 = request->operands[0].reg.value, ZVar2 != request->operands[1].reg.value)) ||
      ((*pZVar7 != ZYDIS_MNEMONIC_NOP ||
       ((ZYDIS_REGISTER_RAX < ZVar2 || ((0x20002000200000U >> ((ulong)ZVar2 & 0x3f) & 1) == 0)))))))
     ) {
    if (request->mnemonic != *pZVar7) {
      ZVar5 = ZydisDecoderInit(&decoder,insn->machine_mode,(uint)(insn->stack_width >> 5));
      if ((int)ZVar5 < 0) {
        pcVar10 = "Failed to initialize decoder\n";
        goto LAB_0010e52e;
      }
      ZVar5 = ZydisDecoderEnableMode(&decoder,ZYDIS_DECODER_MODE_KNC,'\x01');
      if ((int)ZVar5 < 0) {
        pcVar10 = "Failed to enable KNC mode\n";
        goto LAB_0010e52e;
      }
      pZVar1 = &insn->length;
      insn = &knc_insn;
      operands = knc_operands;
      ZVar5 = ZydisDecoderDecodeFull(&decoder,insn_bytes,(ulong)*pZVar1,insn,operands);
      if ((int)ZVar5 < 0) {
        pcVar10 = "Failed to decode instruction\n";
        goto LAB_0010e52e;
      }
      pZVar7 = &knc_insn.mnemonic;
    }
    uVar8 = request->prefixes;
    ZVar6 = request->machine_mode;
    bVar12 = true;
    if ((uVar8 & ~insn->attributes) != 0) {
      if ((uVar8 >> 0x27 & 1) == 0 || ZVar6 == ZYDIS_MACHINE_MODE_LONG_64) {
        bVar12 = false;
      }
      else {
        bVar12 = ((uVar8 & 0xffffff6fffffffff | 0x1000000000) & ~insn->attributes) == 0;
      }
    }
    if (((ZVar6 != insn->machine_mode) || (request->mnemonic != *pZVar7)) ||
       (uVar8 = (ulong)request->operand_count,
       !(bool)(request->operand_count == insn->operand_count_visible & bVar12))) {
      pcVar10 = "Basic instruction attributes mismatch\n";
LAB_0010e52e:
      fputs(pcVar10,_stderr);
      abort();
    }
    pZVar9 = &request->operands[0].imm;
    for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
      if (((ZydisEncoderOperand *)(pZVar9 + -7))->type != operands->type) {
        pcVar10 = "Mismatch for operand %u\n";
        goto LAB_0010e50e;
      }
      switch(((ZydisEncoderOperand *)(pZVar9 + -7))->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        if (((ZydisEncoderOperandReg_ *)((long)pZVar9 + -0x34))->value !=
            (operands->field_10).mem.type) {
          pcVar10 = "Mismatch for register operand %u\n";
          goto LAB_0010e50e;
        }
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar2 = ((ZydisEncoderOperandMem_ *)(pZVar9 + -5))->base;
        if ((((ZVar2 != (operands->field_10).mem.base) ||
             (*(ZydisRegister *)((long)pZVar9 + -0x24) != (operands->field_10).mem.index)) ||
            ((*(ZyanU8 *)(pZVar9 + -4) != (operands->field_10).mem.scale &&
             ((operands->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)))) ||
           (pZVar9[-3].u != (operands->field_10).mem.disp.value)) {
          uVar8 = pZVar9[-3].u;
          if (uVar8 != (operands->field_10).mem.disp.value) {
            if (((*(char *)((long)&operands->field_10 + 0x21) == '\0') ||
                (*(ZydisRegister *)((long)pZVar9 + -0x24) != ZYDIS_REGISTER_NONE)) ||
               ((1 < ZVar2 - ZYDIS_REGISTER_EIP && (ZVar2 != ZYDIS_REGISTER_NONE)))) {
              bVar12 = false;
            }
            else {
              ZydisCalcAbsoluteAddress(insn,operands,0,(ZyanU64 *)&decoder);
              uVar8 = pZVar9[-3].u;
              bVar12 = uVar8 == decoder._0_8_;
              ZVar6 = insn->machine_mode;
            }
            if ((((ZVar6 < (ZYDIS_MACHINE_MODE_LEGACY_16|ZYDIS_MACHINE_MODE_LONG_COMPAT_16)) &&
                 ((0x34U >> (ZVar6 & 0x1f) & 1) != 0)) || (insn->stack_width == '\x10')) ||
               (insn->address_width == '\x10')) {
              bVar12 = (short)*(undefined4 *)((long)&operands->field_10 + 0x18) == (short)uVar8;
            }
            if (bVar12) {
              uVar8 = (ulong)insn->operand_count_visible;
              break;
            }
          }
          pcVar10 = "Mismatch for memory operand %u\n";
LAB_0010e50e:
          fprintf(_stderr,pcVar10,uVar11 & 0xffffffff);
          abort();
        }
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        if ((((ZydisEncoderOperandPtr_ *)(pZVar9 + -1))->segment != (operands->field_10).ptr.segment
            ) || (*(ZyanU32 *)((long)pZVar9 + -4) != (operands->field_10).mem.segment)) {
          pcVar10 = "Mismatch for pointer operand %u\n";
          goto LAB_0010e50e;
        }
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        uVar4 = (operands->field_10).imm.value.u;
        if ((pZVar9->u != uVar4) &&
           (((ZVar3 = (insn->meta).category, ZVar3 != ZYDIS_CATEGORY_LOGICAL &&
             (ZVar3 != ZYDIS_CATEGORY_DATAXFER)) ||
            ((0x3f < operands->size ||
             (((uVar4 ^ pZVar9->u) & ~(-1L << ((byte)operands->size & 0x3f))) != 0)))))) {
          pcVar10 = "Mismatch for immediate operand %u\n";
          goto LAB_0010e50e;
        }
        break;
      default:
        pcVar10 = "Invalid operand type for operand %u\n";
        goto LAB_0010e50e;
      }
      pZVar9 = pZVar9 + 8;
      operands = operands + 1;
    }
  }
  return;
}

Assistant:

void ZydisCompareRequestToInstruction(const ZydisEncoderRequest *request,
    const ZydisDecodedInstruction *insn, const ZydisDecodedOperand* operands, const ZyanU8 *insn_bytes)
{
    // Special case, `xchg rAX, rAX` is an alias for `NOP`
    if ((request->mnemonic == ZYDIS_MNEMONIC_XCHG) &&
        (request->operand_count == 2) &&
        (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[0].reg.value == request->operands[1].reg.value) &&
        (insn->mnemonic == ZYDIS_MNEMONIC_NOP))
    {
        switch (request->operands[0].reg.value)
        {
        case ZYDIS_REGISTER_AX:
        case ZYDIS_REGISTER_EAX:
        case ZYDIS_REGISTER_RAX:
            return;
        default:
            break;
        }
    }

    // Handle possible KNC overlap
    ZydisDecodedInstruction knc_insn;
    ZydisDecodedOperand knc_operands[ZYDIS_MAX_OPERAND_COUNT];
    if (request->mnemonic != insn->mnemonic)
    {
        ZydisDecoder decoder;
        ZydisStackWidth stack_width = (ZydisStackWidth)(insn->stack_width >> 5);
        if (!ZYAN_SUCCESS(ZydisDecoderInit(&decoder, insn->machine_mode, stack_width)))
        {
            fputs("Failed to initialize decoder\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderEnableMode(&decoder, ZYDIS_DECODER_MODE_KNC, ZYAN_TRUE)))
        {
            fputs("Failed to enable KNC mode\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderDecodeFull(&decoder, insn_bytes, insn->length, &knc_insn,
            knc_operands)))
        {
            fputs("Failed to decode instruction\n", ZYAN_STDERR);
            abort();
        }
        insn = &knc_insn;
        operands = knc_operands;
    }

    ZyanBool prefixes_match = ((insn->attributes & request->prefixes) == request->prefixes);
    if (!prefixes_match &&
        (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
        (request->prefixes & ZYDIS_ATTRIB_HAS_SEGMENT_DS))
    {
        // Encoder allows specifying DS override even when it might be interpreted as NOTRACK
        ZyanU64 acceptable_prefixes = (request->prefixes & (~ZYDIS_ATTRIB_HAS_SEGMENT_DS)) |
                                      ZYDIS_ATTRIB_HAS_NOTRACK;
        prefixes_match = ((insn->attributes & acceptable_prefixes) == acceptable_prefixes);
    }
    if ((request->machine_mode != insn->machine_mode) ||
        (request->mnemonic != insn->mnemonic) ||
        (request->operand_count != insn->operand_count_visible) ||
        !prefixes_match)
    {
        fputs("Basic instruction attributes mismatch\n", ZYAN_STDERR);
        abort();
    }

    for (ZyanU8 i = 0; i < insn->operand_count_visible; ++i)
    {
        const ZydisEncoderOperand *op1 = &request->operands[i];
        const ZydisDecodedOperand *op2 = &operands[i];
        if (op1->type != op2->type)
        {
            fprintf(ZYAN_STDERR, "Mismatch for operand %u\n", i);
            abort();
        }
        switch (op1->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            if (op1->reg.value != op2->reg.value)
            {
                fprintf(ZYAN_STDERR, "Mismatch for register operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            if ((op1->mem.base != op2->mem.base) ||
                (op1->mem.index != op2->mem.index) ||
                (op1->mem.scale != op2->mem.scale && op2->mem.type != ZYDIS_MEMOP_TYPE_MIB) ||
                (op1->mem.displacement != op2->mem.disp.value))
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if (op1->mem.displacement != op2->mem.disp.value)
                {
                    if ((op2->mem.disp.size) &&
                        (op1->mem.index == ZYDIS_REGISTER_NONE) &&
                        ((op1->mem.base == ZYDIS_REGISTER_NONE) ||
                         (op1->mem.base == ZYDIS_REGISTER_EIP) ||
                         (op1->mem.base == ZYDIS_REGISTER_RIP)))
                    {
                        ZyanU64 addr;
                        ZydisCalcAbsoluteAddress(insn, op2, 0, &addr);
                        acceptable_mismatch = ((ZyanU64)op1->mem.displacement == addr);
                    }
                    if ((insn->machine_mode == ZYDIS_MACHINE_MODE_REAL_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16) ||
                        (insn->stack_width == 16) ||
                        (insn->address_width == 16))
                    {
                        acceptable_mismatch = ((op1->mem.displacement & 0xFFFF) ==
                            (op2->mem.disp.value & 0xFFFF));
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for memory operand %u\n", i);
                    abort();
                }
            }
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            if ((op1->ptr.segment != op2->ptr.segment) ||
                (op1->ptr.offset != op2->ptr.offset))
            {
                fprintf(ZYAN_STDERR, "Mismatch for pointer operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            if (op1->imm.u != op2->imm.value.u)
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if ((insn->meta.category == ZYDIS_CATEGORY_DATAXFER) ||
                    (insn->meta.category == ZYDIS_CATEGORY_LOGICAL))
                {
                    if (op2->size < 64)
                    {
                        ZyanU64 mask = (1ULL << op2->size) - 1;
                        acceptable_mismatch =
                            (op1->imm.u & mask) == (op2->imm.value.u & mask);
                    }
                    else
                    {
                        acceptable_mismatch = op1->imm.u == op2->imm.value.u;
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for immediate operand %u\n", i);
                    abort();
                }
            }
            break;
        default:
            fprintf(ZYAN_STDERR, "Invalid operand type for operand %u\n", i);
            abort();
        }
    }
}